

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcShow.c
# Opt level: O2

void Wlc_NtkShow(Wlc_Ntk_t *p,Vec_Int_t *vBold)

{
  int iVar1;
  char *__ptr;
  char *__s1;
  FILE *__stream;
  char FileNameDot [200];
  char acStack_e8 [200];
  
  __ptr = Extra_FileDesignName(p->pName);
  if (p->pSpec == (char *)0x0) {
    __s1 = "unknown";
  }
  else {
    __s1 = Extra_FileDesignName(p->pSpec);
  }
  sprintf(acStack_e8,"%s_%s.dot",__ptr,__s1);
  free(__ptr);
  iVar1 = strcmp(__s1,"unknown");
  if ((__s1 != (char *)0x0) && (iVar1 != 0)) {
    free(__s1);
  }
  __stream = fopen(acStack_e8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",acStack_e8);
  }
  else {
    fclose(__stream);
    Wlc_NtkDumpDot(p,acStack_e8,vBold);
    Abc_ShowFile(acStack_e8);
  }
  return;
}

Assistant:

void Wlc_NtkShow( Wlc_Ntk_t * p, Vec_Int_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    FILE * pFile;
    char FileNameDot[200];
    char * pName = Extra_FileDesignName(p->pName);
    char * pSpec = p->pSpec ? Extra_FileDesignName(p->pSpec) : (char *)"unknown";
    sprintf( FileNameDot, "%s_%s.dot", pName, pSpec );
    ABC_FREE( pName );
    if ( strcmp(pSpec, "unknown") )
        ABC_FREE( pSpec );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Wlc_NtkDumpDot( p, FileNameDot, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}